

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::State::begin_deep_copy
          (State *this,Space dst_space,char *dst_name,void *param_3,Space src_space,char *src_name,
          void *param_6,uint64_t param_7)

{
  char *pcVar1;
  string local_58 [8];
  string frame_name;
  char *src_name_local;
  Space src_space_local;
  void *param_3_local;
  char *dst_name_local;
  Space dst_space_local;
  State *this_local;
  
  frame_name.field_2._8_8_ = src_name;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::operator+=(local_58,"\"");
  std::__cxx11::string::operator+=(local_58,dst_name);
  std::__cxx11::string::operator+=(local_58,"\"=\"");
  std::__cxx11::string::operator+=(local_58,(char *)frame_name.field_2._8_8_);
  std::__cxx11::string::operator+=(local_58,"\" (");
  pcVar1 = get_space_name(dst_space);
  std::__cxx11::string::operator+=(local_58,pcVar1);
  std::__cxx11::string::operator+=(local_58,"->");
  pcVar1 = get_space_name(src_space);
  std::__cxx11::string::operator+=(local_58,pcVar1);
  std::__cxx11::string::operator+=(local_58,")");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  begin_frame(this,pcVar1,STACK_COPY);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void begin_deep_copy(Space dst_space, const char* dst_name, const void*,
                       Space src_space, const char* src_name, const void*,
                       std::uint64_t) {
    std::string frame_name;
    frame_name += "\"";
    frame_name += dst_name;
    frame_name += "\"=\"";
    frame_name += src_name;
    frame_name += "\" (";
    frame_name += get_space_name(dst_space);
    frame_name += "->";
    frame_name += get_space_name(src_space);
    frame_name += ")";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }